

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_buffer_message(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ulong uVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  size_t msg_len_00;
  mbedtls_ssl_hs_buffer *pmVar8;
  size_t desired;
  uchar *puVar9;
  ulong offset;
  ulong __n;
  char *pcVar10;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar13;
  undefined8 uVar11;
  ulong uVar12;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar14;
  uchar *bitmask;
  uchar *msg;
  size_t frag_off;
  size_t frag_len;
  size_t reassembly_buf_sz;
  size_t msg_len;
  mbedtls_ssl_hs_buffer *hs_buf;
  uint recv_msg_seq;
  uint recv_msg_seq_offset;
  mbedtls_ssl_handshake_params *hs;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  hs._4_4_ = 0;
  pmVar1 = ssl->handshake;
  if (pmVar1 == (mbedtls_ssl_handshake_params *)0x0) {
    return 0;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1101,"=> ssl_buffer_message");
  if (ssl->in_msgtype == 0x14) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x1105,"Remember CCS message");
    (pmVar1->buffering).seen_ccs = '\x01';
  }
  else if (ssl->in_msgtype == 0x16) {
    uVar4 = (uint)CONCAT11(ssl->in_msg[4],ssl->in_msg[5]);
    uVar2 = ssl->in_hslen;
    msg_len_00 = uVar2 - 0xc;
    if (uVar4 < ssl->handshake->in_msg_seq) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1114,"should never happen");
      return -0x6c00;
    }
    uVar5 = uVar4 - ssl->handshake->in_msg_seq;
    if (uVar5 < 4) {
      uVar11 = CONCAT44(uVar13,uVar5);
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1126,"Buffering HS message with sequence number %u, offset %u ",(ulong)uVar4,
                 uVar11);
      pmVar8 = (pmVar1->buffering).hs + uVar5;
      if ((undefined1  [24])((undefined1  [24])*pmVar8 & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) {
        iVar6 = ssl_hs_is_proper_fragment(ssl);
        *(byte *)pmVar8 = *(byte *)pmVar8 & 0xfd | (iVar6 == 1) << 1;
        if (0x400 < uVar2) goto LAB_00347ea2;
        if (0x8000 < (pmVar1->buffering).total_bytes_buffered) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x113e,"should never happen");
          return -0x6c00;
        }
        desired = ssl_get_reassembly_buffer_size(msg_len_00,(uint)(*(byte *)pmVar8 >> 1 & 1));
        if (0x8000 - (pmVar1->buffering).total_bytes_buffered < desired) {
          if (uVar5 != 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1152,
                       "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                       ,msg_len_00,0x8000,(pmVar1->buffering).total_bytes_buffered);
            goto LAB_00347ea2;
          }
          uVar11 = 0x8000;
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x115d,
                     "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- attempt to make space by freeing buffered future messages\n"
                     ,msg_len_00,0x8000,(pmVar1->buffering).total_bytes_buffered);
          iVar6 = ssl_buffer_make_space(ssl,desired);
          if (iVar6 != 0) {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x116d,
                       "Reassembly of next message of size %zu (%zu with bitmap) would exceed the compile-time limit %zu (already %zu bytes buffered) -- fail\n"
                       ,msg_len_00,desired,0x8000,(pmVar1->buffering).total_bytes_buffered);
            hs._4_4_ = -0x6a00;
            goto LAB_00347ea2;
          }
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x1176,"initialize reassembly, total length = %zu",msg_len_00,uVar11);
        puVar9 = (uchar *)calloc(1,desired);
        pmVar8->data = puVar9;
        if (pmVar8->data == (uchar *)0x0) {
          hs._4_4_ = -0x7f00;
          goto LAB_00347ea2;
        }
        pmVar8->data_len = desired;
        puVar9 = pmVar8->data;
        puVar3 = ssl->in_msg;
        *(undefined4 *)puVar9 = *(undefined4 *)puVar3;
        *(undefined2 *)(puVar9 + 4) = *(undefined2 *)(puVar3 + 4);
        memset(pmVar8->data + 6,0,3);
        puVar9 = pmVar8->data;
        puVar3 = pmVar8->data;
        *(undefined2 *)(puVar9 + 9) = *(undefined2 *)(puVar3 + 1);
        puVar9[0xb] = puVar3[3];
        *(byte *)pmVar8 = *(byte *)pmVar8 & 0xfe | 1;
        (pmVar1->buffering).total_bytes_buffered =
             desired + (pmVar1->buffering).total_bytes_buffered;
      }
      else if (*(int *)pmVar8->data != *(int *)ssl->in_msg) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x118b,"Fragment header mismatch - ignore");
        goto LAB_00347ea2;
      }
      if ((*(byte *)pmVar8 >> 2 & 1) == 0) {
        puVar9 = pmVar8->data;
        uVar7 = ssl_get_hs_frag_off(ssl);
        offset = (ulong)uVar7;
        uVar7 = ssl_get_hs_frag_len(ssl);
        __n = (ulong)uVar7;
        uVar12 = __n;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x11a0,"adding fragment, offset = %zu, length = %zu",offset,__n);
        memcpy(puVar9 + offset + 0xc,ssl->in_msg + 0xc,__n);
        if ((*(byte *)pmVar8 >> 1 & 1) == 0) {
          *(byte *)pmVar8 = *(byte *)pmVar8 & 0xfb | 4;
        }
        else {
          puVar9 = puVar9 + uVar2;
          ssl_bitmask_set(puVar9,offset,__n);
          iVar6 = ssl_bitmask_check(puVar9,msg_len_00);
          *(byte *)pmVar8 = *(byte *)pmVar8 & 0xfb | (iVar6 == 0) << 2;
        }
        pcVar10 = "not yet ";
        if ((*(byte *)pmVar8 >> 2 & 1) != 0) {
          pcVar10 = anon_var_dwarf_36a810 + 9;
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x11ad,"message %scomplete",pcVar10,uVar12);
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1120,
                 "Ignore future HS message with sequence number %u, buffering window %u - %u",
                 (ulong)uVar4,CONCAT44(uVar13,ssl->handshake->in_msg_seq),
                 CONCAT44(uVar14,ssl->handshake->in_msg_seq + 3));
    }
  }
LAB_00347ea2:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x11ba,"<= ssl_buffer_message");
  return hs._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_buffer_message(mbedtls_ssl_context *ssl)
{
    int ret = 0;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;

    if (hs == NULL) {
        return 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> ssl_buffer_message"));

    switch (ssl->in_msgtype) {
        case MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC:
            MBEDTLS_SSL_DEBUG_MSG(2, ("Remember CCS message"));

            hs->buffering.seen_ccs = 1;
            break;

        case MBEDTLS_SSL_MSG_HANDSHAKE:
        {
            unsigned recv_msg_seq_offset;
            unsigned recv_msg_seq = (ssl->in_msg[4] << 8) | ssl->in_msg[5];
            mbedtls_ssl_hs_buffer *hs_buf;
            size_t msg_len = ssl->in_hslen - 12;

            /* We should never receive an old handshake
             * message - double-check nonetheless. */
            if (recv_msg_seq < ssl->handshake->in_msg_seq) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }

            recv_msg_seq_offset = recv_msg_seq - ssl->handshake->in_msg_seq;
            if (recv_msg_seq_offset >= MBEDTLS_SSL_MAX_BUFFERED_HS) {
                /* Silently ignore -- message too far in the future */
                MBEDTLS_SSL_DEBUG_MSG(2,
                                      ("Ignore future HS message with sequence number %u, "
                                       "buffering window %u - %u",
                                       recv_msg_seq, ssl->handshake->in_msg_seq,
                                       ssl->handshake->in_msg_seq + MBEDTLS_SSL_MAX_BUFFERED_HS -
                                       1));

                goto exit;
            }

            MBEDTLS_SSL_DEBUG_MSG(2, ("Buffering HS message with sequence number %u, offset %u ",
                                      recv_msg_seq, recv_msg_seq_offset));

            hs_buf = &hs->buffering.hs[recv_msg_seq_offset];

            /* Check if the buffering for this seq nr has already commenced. */
            if (!hs_buf->is_valid) {
                size_t reassembly_buf_sz;

                hs_buf->is_fragmented =
                    (ssl_hs_is_proper_fragment(ssl) == 1);

                /* We copy the message back into the input buffer
                 * after reassembly, so check that it's not too large.
                 * This is an implementation-specific limitation
                 * and not one from the standard, hence it is not
                 * checked in ssl_check_hs_header(). */
                if (msg_len + 12 > MBEDTLS_SSL_IN_CONTENT_LEN) {
                    /* Ignore message */
                    goto exit;
                }

                /* Check if we have enough space to buffer the message. */
                if (hs->buffering.total_bytes_buffered >
                    MBEDTLS_SSL_DTLS_MAX_BUFFERING) {
                    MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
                    return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
                }

                reassembly_buf_sz = ssl_get_reassembly_buffer_size(msg_len,
                                                                   hs_buf->is_fragmented);

                if (reassembly_buf_sz > (MBEDTLS_SSL_DTLS_MAX_BUFFERING -
                                         hs->buffering.total_bytes_buffered)) {
                    if (recv_msg_seq_offset > 0) {
                        /* If we can't buffer a future message because
                         * of space limitations -- ignore. */
                        MBEDTLS_SSL_DEBUG_MSG(2,
                                              ("Buffering of future message of size %"
                                               MBEDTLS_PRINTF_SIZET
                                               " would exceed the compile-time limit %"
                                               MBEDTLS_PRINTF_SIZET
                                               " (already %" MBEDTLS_PRINTF_SIZET
                                               " bytes buffered) -- ignore\n",
                                               msg_len, (size_t) MBEDTLS_SSL_DTLS_MAX_BUFFERING,
                                               hs->buffering.total_bytes_buffered));
                        goto exit;
                    } else {
                        MBEDTLS_SSL_DEBUG_MSG(2,
                                              ("Buffering of future message of size %"
                                               MBEDTLS_PRINTF_SIZET
                                               " would exceed the compile-time limit %"
                                               MBEDTLS_PRINTF_SIZET
                                               " (already %" MBEDTLS_PRINTF_SIZET
                                               " bytes buffered) -- attempt to make space by freeing buffered future messages\n",
                                               msg_len, (size_t) MBEDTLS_SSL_DTLS_MAX_BUFFERING,
                                               hs->buffering.total_bytes_buffered));
                    }

                    if (ssl_buffer_make_space(ssl, reassembly_buf_sz) != 0) {
                        MBEDTLS_SSL_DEBUG_MSG(2,
                                              ("Reassembly of next message of size %"
                                               MBEDTLS_PRINTF_SIZET
                                               " (%" MBEDTLS_PRINTF_SIZET
                                               " with bitmap) would exceed"
                                               " the compile-time limit %"
                                               MBEDTLS_PRINTF_SIZET
                                               " (already %" MBEDTLS_PRINTF_SIZET
                                               " bytes buffered) -- fail\n",
                                               msg_len,
                                               reassembly_buf_sz,
                                               (size_t) MBEDTLS_SSL_DTLS_MAX_BUFFERING,
                                               hs->buffering.total_bytes_buffered));
                        ret = MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL;
                        goto exit;
                    }
                }

                MBEDTLS_SSL_DEBUG_MSG(2,
                                      ("initialize reassembly, total length = %"
                                       MBEDTLS_PRINTF_SIZET,
                                       msg_len));

                hs_buf->data = mbedtls_calloc(1, reassembly_buf_sz);
                if (hs_buf->data == NULL) {
                    ret = MBEDTLS_ERR_SSL_ALLOC_FAILED;
                    goto exit;
                }
                hs_buf->data_len = reassembly_buf_sz;

                /* Prepare final header: copy msg_type, length and message_seq,
                 * then add standardised fragment_offset and fragment_length */
                memcpy(hs_buf->data, ssl->in_msg, 6);
                memset(hs_buf->data + 6, 0, 3);
                memcpy(hs_buf->data + 9, hs_buf->data + 1, 3);

                hs_buf->is_valid = 1;

                hs->buffering.total_bytes_buffered += reassembly_buf_sz;
            } else {
                /* Make sure msg_type and length are consistent */
                if (memcmp(hs_buf->data, ssl->in_msg, 4) != 0) {
                    MBEDTLS_SSL_DEBUG_MSG(1, ("Fragment header mismatch - ignore"));
                    /* Ignore */
                    goto exit;
                }
            }

            if (!hs_buf->is_complete) {
                size_t frag_len, frag_off;
                unsigned char * const msg = hs_buf->data + 12;

                /*
                 * Check and copy current fragment
                 */

                /* Validation of header fields already done in
                 * mbedtls_ssl_prepare_handshake_record(). */
                frag_off = ssl_get_hs_frag_off(ssl);
                frag_len = ssl_get_hs_frag_len(ssl);

                MBEDTLS_SSL_DEBUG_MSG(2, ("adding fragment, offset = %" MBEDTLS_PRINTF_SIZET
                                          ", length = %" MBEDTLS_PRINTF_SIZET,
                                          frag_off, frag_len));
                memcpy(msg + frag_off, ssl->in_msg + 12, frag_len);

                if (hs_buf->is_fragmented) {
                    unsigned char * const bitmask = msg + msg_len;
                    ssl_bitmask_set(bitmask, frag_off, frag_len);
                    hs_buf->is_complete = (ssl_bitmask_check(bitmask,
                                                             msg_len) == 0);
                } else {
                    hs_buf->is_complete = 1;
                }

                MBEDTLS_SSL_DEBUG_MSG(2, ("message %scomplete",
                                          hs_buf->is_complete ? "" : "not yet "));
            }

            break;
        }

        default:
            /* We don't buffer other types of messages. */
            break;
    }

exit:

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= ssl_buffer_message"));
    return ret;
}